

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

Bitmap * __thiscall lunasvg::Bitmap::operator=(Bitmap *this,Bitmap *bitmap)

{
  plutovg_surface *__tmp;
  plutovg_surface_t *ppVar1;
  Bitmap local_10;
  
  ppVar1 = plutovg_surface_reference(bitmap->m_surface);
  local_10 = (Bitmap)this->m_surface;
  this->m_surface = ppVar1;
  ~Bitmap(&local_10);
  return this;
}

Assistant:

Bitmap& Bitmap::operator=(const Bitmap& bitmap)
{
    Bitmap(bitmap).swap(*this);
    return *this;
}